

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFIXED.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [128];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)((float)(int)*(short *)((long)this + 8) * 0.00390625));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

KString KFIXED<Type, BinaryPoint>::GetAsString() const
{
    KStringStream ss;

    ss << GetAsFloat32() << "\n";

    return ss.str();
}